

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

autodiff_fvar<float,_1UL> __thiscall
anon_unknown.dwarf_57e16::func<float>::operator()(func<float> *this,float beta)

{
  promote<fvar<float,_1UL>,_fvar<float,_1UL>_> pVar1;
  autodiff_fvar<float,_1UL> aVar2;
  autodiff_fvar<float,_1UL> beta_fvar;
  float local_48;
  float local_44;
  array<float,_2UL> local_40;
  array<float,_2UL> local_38;
  array<float,_2UL> local_30;
  array<float,_2UL> local_28;
  fvar<float,_1UL> local_20;
  
  local_20.v._M_elems[1] = 1.0;
  local_20.v._M_elems[0] = beta;
  local_44 = this->Jx_ + this->Jx_;
  local_30._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_1UL>::operator*
                        (&local_20,&local_44);
  local_28._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>
                        ((fvar<float,_1UL> *)&local_30);
  local_48 = this->Jy_ + this->Jy_;
  local_40._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_1UL>::operator*
                        (&local_20,&local_48);
  local_38._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::sinh<float,1ul>
                        ((fvar<float,_1UL> *)&local_40);
  pVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<float,1ul>::operator*
                    ((fvar<float,1ul> *)&local_28,(fvar<float,_1UL> *)&local_38);
  aVar2.v._M_elems[1] = pVar1.v._M_elems[1];
  aVar2.v._M_elems[0] = pVar1.v._M_elems[0] + -1.0;
  return (autodiff_fvar<float,_1UL>)aVar2.v._M_elems;
}

Assistant:

auto operator()(T beta) const -> decltype(boost::math::differentiation::make_fvar<T, 1>(beta)) {
    using std::sinh;
    auto beta_fvar = boost::math::differentiation::make_fvar<T, 1>(beta);
    return sinh(2 * Jx_ * beta_fvar) * sinh(2 * Jy_ * beta_fvar) - 1;
  }